

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void test_master_table_dictionary_create_delete
               (planck_unit_test_t *tc,Dictionary<int,_int> *dictionary,
               ion_dictionary_size_t dictionary_size,ion_dictionary_type_t dictionary_type)

{
  ion_dictionary_id_t id_00;
  MasterTable *this;
  ion_dictionary_id_t id;
  MasterTable *master_table;
  ion_dictionary_type_t dictionary_type_local;
  ion_dictionary_size_t dictionary_size_local;
  Dictionary<int,_int> *dictionary_local;
  planck_unit_test_t *tc_local;
  
  this = (MasterTable *)operator_new(0x50);
  MasterTable::MasterTable(this);
  master_table_setup(tc,this);
  master_table_init(tc,this);
  master_table_dictionary_add
            (tc,this,dictionary,key_type_numeric_signed,4,4,dictionary_size,dictionary_type);
  id_00 = ((dictionary->dict).instance)->id;
  if (dictionary != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(dictionary);
    operator_delete(dictionary);
  }
  master_table_delete_from_master_table(tc,this,id_00);
  if (this != (MasterTable *)0x0) {
    MasterTable::~MasterTable(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void
test_master_table_dictionary_create_delete(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dictionary,
	ion_dictionary_size_t dictionary_size,
	ion_dictionary_type_t dictionary_type
) {
	MasterTable *master_table = new MasterTable();

	master_table_setup(tc, master_table);
	master_table_init(tc, master_table);
	master_table_dictionary_add(tc, master_table, dictionary, key_type_numeric_signed, sizeof(int), sizeof(int), dictionary_size, dictionary_type);

	ion_dictionary_id_t id = dictionary->dict.instance->id;

	delete dictionary;

	master_table_delete_from_master_table(tc, master_table, id);

	delete master_table;
}